

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpStateVarRequest.c
# Opt level: O1

int UpnpStateVarRequest_assign(UpnpStateVarRequest *p,UpnpStateVarRequest *q)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  sockaddr_storage *psVar12;
  sockaddr_storage *psVar13;
  byte bVar14;
  
  bVar14 = 0;
  if (p == q) {
    iVar8 = 1;
  }
  else {
    p->m_ErrCode = q->m_ErrCode;
    p->m_Socket = q->m_Socket;
    pcVar9 = UpnpString_get_String(q->m_ErrStr);
    iVar7 = UpnpString_set_String(p->m_ErrStr,pcVar9);
    iVar11 = 0;
    iVar8 = 0;
    if (iVar7 != 0) {
      pcVar9 = UpnpString_get_String(q->m_DevUDN);
      iVar7 = UpnpString_set_String(p->m_DevUDN,pcVar9);
      iVar8 = iVar11;
      if (iVar7 != 0) {
        pcVar9 = UpnpString_get_String(q->m_ServiceID);
        iVar7 = UpnpString_set_String(p->m_ServiceID,pcVar9);
        if (iVar7 != 0) {
          pcVar9 = UpnpString_get_String(q->m_StateVarName);
          iVar7 = UpnpString_set_String(p->m_StateVarName,pcVar9);
          if (iVar7 != 0) {
            psVar12 = &q->m_CtrlPtIPAddr;
            psVar13 = &p->m_CtrlPtIPAddr;
            for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
              cVar1 = psVar12->__ss_padding[0];
              cVar2 = psVar12->__ss_padding[1];
              cVar3 = psVar12->__ss_padding[2];
              cVar4 = psVar12->__ss_padding[3];
              cVar5 = psVar12->__ss_padding[4];
              cVar6 = psVar12->__ss_padding[5];
              psVar13->ss_family = psVar12->ss_family;
              psVar13->__ss_padding[0] = cVar1;
              psVar13->__ss_padding[1] = cVar2;
              psVar13->__ss_padding[2] = cVar3;
              psVar13->__ss_padding[3] = cVar4;
              psVar13->__ss_padding[4] = cVar5;
              psVar13->__ss_padding[5] = cVar6;
              psVar12 = (sockaddr_storage *)((long)psVar12 + (ulong)bVar14 * -0x10 + 8);
              psVar13 = (sockaddr_storage *)((long)psVar13 + (ulong)bVar14 * -0x10 + 8);
            }
            iVar8 = UpnpStateVarRequest_set_CurrentVal(p,q->m_CurrentVal);
            return iVar8;
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int UpnpStateVarRequest_assign(
	UpnpStateVarRequest *p, const UpnpStateVarRequest *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpStateVarRequest_set_ErrCode(
				   p, UpnpStateVarRequest_get_ErrCode(q));
		ok = ok && UpnpStateVarRequest_set_Socket(
				   p, UpnpStateVarRequest_get_Socket(q));
		ok = ok && UpnpStateVarRequest_set_ErrStr(
				   p, UpnpStateVarRequest_get_ErrStr(q));
		ok = ok && UpnpStateVarRequest_set_DevUDN(
				   p, UpnpStateVarRequest_get_DevUDN(q));
		ok = ok && UpnpStateVarRequest_set_ServiceID(
				   p, UpnpStateVarRequest_get_ServiceID(q));
		ok = ok && UpnpStateVarRequest_set_StateVarName(
				   p, UpnpStateVarRequest_get_StateVarName(q));
		ok = ok && UpnpStateVarRequest_set_CtrlPtIPAddr(
				   p, UpnpStateVarRequest_get_CtrlPtIPAddr(q));
		ok = ok && UpnpStateVarRequest_set_CurrentVal(
				   p, UpnpStateVarRequest_get_CurrentVal(q));
	}

	return ok;
}